

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void sat_solver2_rollback(sat_solver2 *s)

{
  uint uVar1;
  uint uVar2;
  Vec_Set_t *pVVar3;
  int *piVar4;
  uint *puVar5;
  veci *pvVar6;
  int **ppiVar7;
  long lVar8;
  int *piVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  
  sat_solver2_rollback::Count = sat_solver2_rollback::Count + 1;
  if ((s->iVarPivot < 0) || (s->size < s->iVarPivot)) {
    __assert_fail("s->iVarPivot >= 0 && s->iVarPivot <= s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x638,"void sat_solver2_rollback(sat_solver2 *)");
  }
  iVar13 = s->iTrailPivot;
  lVar16 = (long)iVar13;
  if (lVar16 < 0) {
LAB_008db414:
    __assert_fail("s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x639,"void sat_solver2_rollback(sat_solver2 *)");
  }
  iVar11 = s->qtail;
  lVar8 = (long)iVar11;
  if (iVar11 < iVar13) goto LAB_008db414;
  pVVar3 = s->pPrf1;
  if ((pVVar3 != (Vec_Set_t *)0x0) &&
     ((s->hProofPivot < 1 ||
      ((pVVar3->iPage << ((byte)pVVar3->nPageSize & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage] <
       s->hProofPivot)))) {
    __assert_fail("s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x63a,"void sat_solver2_rollback(sat_solver2 *)");
  }
  if ((s->trail_lim).size != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x209,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
  }
  if (iVar11 != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x20a,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
  }
  if (iVar13 < iVar11) {
    do {
      lVar15 = lVar8 + -1;
      lVar8 = lVar8 + -1;
      iVar11 = s->trail[lVar15] >> 1;
      s->assigns[iVar11] = '\x03';
      s->reasons[iVar11] = 0;
      s->units[iVar11] = 0;
    } while (lVar16 < lVar8);
  }
  lVar8 = (long)s->qhead;
  if (iVar13 < s->qhead) {
    do {
      lVar15 = lVar8 + -1;
      lVar8 = lVar8 + -1;
      order_unassigned(s,s->trail[lVar15] >> 1);
    } while (lVar16 < lVar8);
  }
  s->qtail = iVar13;
  s->qhead = iVar13;
  if (s->iVarPivot < s->size) {
    if (s->activity2 != (uint *)0x0) {
      s->var_inc = s->var_inc2;
      memcpy(s->activity,s->activity2,(long)s->iVarPivot << 2);
    }
    if ((s->order).size < 0) goto LAB_008db3b7;
    (s->order).size = 0;
    if (0 < s->iVarPivot) {
      lVar16 = 0;
      do {
        if (s->assigns[lVar16] == '\x03') {
          s->orderpos[lVar16] = (s->order).size;
          uVar1 = (s->order).cap;
          if ((s->order).size == uVar1) {
            iVar13 = (uVar1 >> 1) * 3;
            if ((int)uVar1 < 4) {
              iVar13 = uVar1 * 2;
            }
            piVar9 = (s->order).ptr;
            if (piVar9 == (int *)0x0) {
              piVar9 = (int *)malloc((long)iVar13 << 2);
            }
            else {
              piVar9 = (int *)realloc(piVar9,(long)iVar13 << 2);
            }
            (s->order).ptr = piVar9;
            if (piVar9 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->order).cap * 9.5367431640625e-07,0),
                     (double)iVar13 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->order).cap = iVar13;
          }
          iVar13 = (s->order).size;
          (s->order).size = iVar13 + 1;
          (s->order).ptr[iVar13] = (int)lVar16;
          piVar9 = s->orderpos;
          piVar4 = (s->order).ptr;
          uVar1 = piVar9[lVar16];
          uVar12 = (ulong)(int)uVar1;
          iVar13 = piVar4[uVar12];
          if (uVar12 != 0) {
            if (uVar1 == 0xffffffff) {
              __assert_fail("s->orderpos[v] != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                            ,0xf2,"void order_update(sat_solver2 *, int)");
            }
            puVar5 = s->activity;
            do {
              uVar2 = (uint)uVar12;
              uVar14 = (int)((uVar2 - ((int)(uVar2 - 1) >> 0x1f)) + -1) >> 1;
              iVar11 = piVar4[(int)uVar14];
              uVar1 = uVar2;
              if (puVar5[iVar13] <= puVar5[iVar11]) break;
              piVar4[(int)uVar2] = iVar11;
              piVar9[iVar11] = uVar2;
              uVar12 = (ulong)uVar14;
              uVar1 = uVar14;
            } while (2 < uVar2);
          }
          piVar4[(int)uVar1] = iVar13;
          piVar9[iVar13] = uVar1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < s->iVarPivot);
    }
  }
  if (s->iVarPivot < 1) {
    uVar12 = (ulong)(uint)(s->iVarPivot * 2);
  }
  else {
    pvVar6 = s->wlists;
    lVar16 = 0;
    do {
      iVar13 = pvVar6[lVar16].size;
      iVar11 = 0;
      if (0 < iVar13) {
        piVar9 = pvVar6[lVar16].ptr;
        lVar8 = 0;
        iVar11 = 0;
        do {
          uVar1 = piVar9[lVar8];
          if ((int)uVar1 < (s->Mem).BookMarkH[((s->Mem).uLearnedMask & uVar1) != 0]) {
            lVar15 = (long)iVar11;
            iVar11 = iVar11 + 1;
            piVar9[lVar15] = uVar1;
          }
          lVar8 = lVar8 + 1;
          iVar13 = pvVar6[lVar16].size;
        } while (lVar8 < iVar13);
      }
      if (iVar13 < iVar11) goto LAB_008db3b7;
      pvVar6[lVar16].size = iVar11;
      lVar16 = lVar16 + 1;
      uVar12 = (long)s->iVarPivot * 2;
    } while (SBORROW8(lVar16,uVar12) != lVar16 + (long)s->iVarPivot * -2 < 0);
  }
  lVar16 = (long)s->size * 2;
  iVar13 = (int)uVar12;
  if (iVar13 < (int)lVar16) {
    lVar16 = lVar16 - iVar13;
    piVar9 = &s->wlists[iVar13].size;
    do {
      *piVar9 = 0;
      piVar9 = piVar9 + 4;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  uVar1 = (s->Mem).BookMarkE[0];
  (s->stats).clauses = uVar1;
  uVar2 = (s->Mem).BookMarkE[1];
  (s->stats).learnts = uVar2;
  (s->Mem).nEntries[0] = uVar1;
  (s->Mem).nEntries[1] = uVar2;
  bVar10 = (byte)(s->Mem).nPageSize;
  uVar1 = (s->Mem).BookMarkH[0];
  iVar13 = (s->Mem).BookMarkH[1];
  iVar11 = (int)uVar1 >> (bVar10 & 0x1f);
  (s->Mem).iPage[0] = iVar11;
  (s->Mem).iPage[1] = iVar13 >> (bVar10 & 0x1f);
  ppiVar7 = (s->Mem).pPages;
  *ppiVar7[iVar11] = uVar1 & (s->Mem).uPageMask;
  *ppiVar7[(s->Mem).iPage[1]] = (s->Mem).uPageMask & (s->Mem).BookMarkH[1];
  uVar1 = (s->stats).learnts;
  if ((s->act_clas).size < (int)uVar1) {
LAB_008db3b7:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->act_clas).size = uVar1;
  pVVar3 = s->pPrf1;
  if (pVVar3 != (Vec_Set_t *)0x0) {
    if ((s->claProofs).size < (int)uVar1) goto LAB_008db3b7;
    (s->claProofs).size = uVar1;
    bVar10 = (byte)pVVar3->nPageSize;
    uVar1 = s->hProofPivot;
    if ((pVVar3->iPage << (bVar10 & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage] < (int)uVar1) {
      __assert_fail("h <= Vec_SetHandCurrent(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                    ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
    }
    iVar13 = (int)uVar1 >> (bVar10 & 0x1f);
    pVVar3->iPage = iVar13;
    *pVVar3->pPages[iVar13] = (long)(int)(pVVar3->uPageMask & uVar1);
  }
  if (s->pPrf2 != (Prf_Man_t *)0x0) {
    __assert_fail("s->pPrf2 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x66c,"void sat_solver2_rollback(sat_solver2 *)");
  }
  s->size = s->iVarPivot;
  if (s->iVarPivot == 0) {
    s->qhead = 0;
    s->qtail = 0;
    s->cla_inc = 0x800;
    s->root_level = 0;
    s->random_seed = 91648253.0;
    s->progress_estimate = 0.0;
    s->verbosity = 0;
    s->var_inc = 0x20;
    (s->stats).starts = 0;
    (s->stats).clauses = 0;
    (s->stats).learnts = 0;
    (s->stats).decisions = 0;
    (s->stats).propagations = 0;
    (s->stats).inspects = 0;
    (s->stats).conflicts = 0;
    (s->stats).clauses_literals = 0;
    (s->stats).learnts_literals = 0;
    (s->stats).tot_literals = 0;
    s->hLearntLast = -1;
    s->hProofLast = -1;
    s->iVarPivot = 0;
    s->iTrailPivot = 0;
    s->hProofPivot = 1;
  }
  return;
}

Assistant:

void sat_solver2_rollback( sat_solver2* s )
{
    Sat_Mem_t * pMem = &s->Mem;
    int i, k, j;
    static int Count = 0;
    Count++;
    assert( s->iVarPivot >= 0 && s->iVarPivot <= s->size );
    assert( s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail );
    assert( s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1)) );
    // reset implication queue
    solver2_canceluntil_rollback( s, s->iTrailPivot );
    // update order 
    if ( s->iVarPivot < s->size )
    { 
        if ( s->activity2 )
        {
            s->var_inc = s->var_inc2;
            memcpy( s->activity, s->activity2, sizeof(unsigned) * s->iVarPivot );
        }
        veci_resize(&s->order, 0);
        for ( i = 0; i < s->iVarPivot; i++ )
        {
            if ( var_value(s, i) != varX )
                continue;
            s->orderpos[i] = veci_size(&s->order);
            veci_push(&s->order,i);
            order_update(s, i);
        }
    }
    // compact watches
    for ( i = 0; i < s->iVarPivot*2; i++ )
    {
        cla* pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
            if ( Sat_MemClauseUsed(pMem, pArray[k]) )
                pArray[j++] = pArray[k];
        veci_resize(&s->wlists[i],j);
    }
    // reset watcher lists
    for ( i = 2*s->iVarPivot; i < 2*s->size; i++ )
        s->wlists[i].size = 0;

    // reset clause counts
    s->stats.clauses = pMem->BookMarkE[0];
    s->stats.learnts = pMem->BookMarkE[1];
    // rollback clauses
    Sat_MemRollBack( pMem );

    // resize learned arrays
    veci_resize(&s->act_clas,  s->stats.learnts);
    if ( s->pPrf1 ) 
    {
        veci_resize(&s->claProofs, s->stats.learnts);
        Vec_SetShrink(s->pPrf1, s->hProofPivot); 
        // some weird bug here, which shows only on 64-bits!
        // temporarily, perform more general proof reduction
//        Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }
    assert( s->pPrf2 == NULL );
//    if ( s->pPrf2 )
//        Prf_ManShrink( s->pPrf2, s->stats.learnts );

    // initialize other vars
    s->size = s->iVarPivot;
    if ( s->size == 0 )
    {
    //    s->size                   = 0;
    //    s->cap                    = 0;
        s->qhead                  = 0;
        s->qtail                  = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->var_inc                = 1;
        s->cla_inc                = 1;
        s->var_decay              = (float)(1 / 0.95  );
        s->cla_decay              = (float)(1 / 0.999 );
#else
        s->var_inc                = (1 <<  5);
        s->cla_inc                = (1 << 11);
#endif
        s->root_level             = 0;
        s->random_seed            = 91648253;
        s->progress_estimate      = 0;
        s->verbosity              = 0;

        s->stats.starts           = 0;
        s->stats.decisions        = 0;
        s->stats.propagations     = 0;
        s->stats.inspects         = 0;
        s->stats.conflicts        = 0;
        s->stats.clauses          = 0;
        s->stats.clauses_literals = 0;
        s->stats.learnts          = 0;
        s->stats.learnts_literals = 0;
        s->stats.tot_literals     = 0;
        // initialize clause pointers
        s->hLearntLast            = -1; // the last learnt clause 
        s->hProofLast             = -1; // the last proof ID

        // initialize rollback
        s->iVarPivot              =  0; // the pivot for variables
        s->iTrailPivot            =  0; // the pivot for trail
        s->hProofPivot            =  1; // the pivot for proof records
    }
}